

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O1

uint __thiscall
crnlib::symbol_codec::encode_transmit_static_huffman_data_model
          (symbol_codec *this,static_huffman_data_model *model,bool simulate,
          static_huffman_data_model *pDeltaModel)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  symbol_codec *this_00;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uchar *puVar7;
  uint uVar8;
  undefined7 in_register_00000011;
  uint i;
  uint uVar9;
  uint uVar10;
  byte *pbVar11;
  uint min_new_capacity;
  uint uVar12;
  uint uVar13;
  uint cur_nonzero_run_size;
  uint cur_zero_run_size;
  vector<unsigned_short> codes;
  vector<unsigned_char> delta_code_sizes;
  static_huffman_data_model dm;
  uint16 hist [21];
  uint local_d4;
  undefined4 local_d0;
  uint local_cc;
  vector<unsigned_short> local_c8;
  elemental_vector local_b8;
  symbol_codec *local_a8;
  static_huffman_data_model local_a0;
  short local_68 [28];
  
  local_d0 = (undefined4)CONCAT71(in_register_00000011,simulate);
  uVar9 = model->m_total_syms;
  puVar7 = (model->m_code_sizes).m_p + uVar9;
  min_new_capacity = 0;
  uVar5 = 0;
  do {
    puVar7 = puVar7 + -1;
    if (uVar9 == uVar5) goto LAB_001a5509;
    uVar5 = uVar5 + 1;
  } while (*puVar7 == '\0');
  min_new_capacity = (uVar9 - (int)uVar5) + 1;
LAB_001a5509:
  if (min_new_capacity == 0) {
    if (simulate) {
      return 0xe;
    }
    record_put_bits(this,0,0xe);
    return 0xe;
  }
  local_c8.m_p = (unsigned_short *)0x0;
  local_c8.m_size = 0;
  local_c8.m_capacity = 0;
  local_a8 = this;
  vector<unsigned_short>::reserve(&local_c8,uVar9);
  uVar9 = 0;
  local_cc = 0;
  local_d4 = 0;
  pbVar11 = (model->m_code_sizes).m_p;
  local_b8.m_p = (byte *)0x0;
  local_b8.m_size = 0;
  local_b8.m_capacity = 0;
  if ((pDeltaModel != (static_huffman_data_model *)0x0) && (pDeltaModel->m_total_syms != 0)) {
    uVar13 = 0;
    if ((pDeltaModel->m_code_sizes).m_size < min_new_capacity) goto LAB_001a58be;
    if (min_new_capacity != 0) {
      if (min_new_capacity != 0) {
        elemental_vector::increase_capacity
                  (&local_b8,min_new_capacity,min_new_capacity == 1,1,(object_mover)0x0,false);
      }
      memset((byte *)((long)local_b8.m_p + (local_b8._8_8_ & 0xffffffff)),0,
             (ulong)(min_new_capacity - local_b8.m_size));
      local_b8.m_size = min_new_capacity;
    }
    uVar5 = 0;
    do {
      uVar8 = (uint)(model->m_code_sizes).m_p[uVar5] - (uint)(pDeltaModel->m_code_sizes).m_p[uVar5];
      uVar10 = uVar8 + 0x11 & 0xff;
      if (-1 < (int)uVar8) {
        uVar10 = uVar8;
      }
      *(byte *)((long)local_b8.m_p + uVar5) = (byte)uVar10;
      uVar5 = uVar5 + 1;
      pbVar11 = (byte *)local_b8.m_p;
    } while (min_new_capacity + (min_new_capacity == 0) != uVar5);
  }
  uVar13 = 0xffffffff;
  do {
    uVar12 = 0xff;
    if (uVar9 < min_new_capacity) {
      uVar12 = (uint)*pbVar11;
      pbVar11 = pbVar11 + 1;
    }
    if (uVar12 == 0) {
      end_nonzero_run(&local_d4,uVar13,&local_c8);
      local_cc = local_cc + 1;
      if (local_cc == 0x8a) {
        end_zero_run(&local_cc,&local_c8);
      }
    }
    else {
      end_zero_run(&local_cc,&local_c8);
      if (uVar12 == uVar13) {
        local_d4 = local_d4 + 1;
        if (local_d4 == 0x46) {
          end_nonzero_run(&local_d4,uVar13,&local_c8);
        }
      }
      else {
        end_nonzero_run(&local_d4,uVar13,&local_c8);
        if (uVar12 != 0xff) {
          if (local_c8.m_capacity <= local_c8.m_size) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&local_c8,local_c8.m_size + 1,true,2,(object_mover)0x0,
                       false);
          }
          local_c8.m_p[local_c8._8_8_ & 0xffffffff] = (unsigned_short)uVar12;
          local_c8.m_size = local_c8.m_size + 1;
        }
      }
    }
    uVar9 = uVar9 + 1;
    uVar13 = uVar12;
  } while (uVar9 <= min_new_capacity);
  local_68[0x10] = 0;
  local_68[0x11] = 0;
  local_68[0x12] = 0;
  local_68[0x13] = 0;
  local_68[0x14] = 0;
  local_68[8] = 0;
  local_68[9] = 0;
  local_68[10] = 0;
  local_68[0xb] = 0;
  local_68[0xc] = 0;
  local_68[0xd] = 0;
  local_68[0xe] = 0;
  local_68[0xf] = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_68[4] = 0;
  local_68[5] = 0;
  local_68[6] = 0;
  local_68[7] = 0;
  if ((local_c8._8_8_ & 0xffffffff) != 0) {
    uVar5 = 0;
    do {
      local_68[(byte)local_c8.m_p[uVar5]] = local_68[(byte)local_c8.m_p[uVar5]] + 1;
      uVar5 = uVar5 + 1;
    } while ((local_c8._8_8_ & 0xffffffff) != uVar5);
  }
  static_huffman_data_model::static_huffman_data_model(&local_a0);
  iVar4 = static_huffman_data_model::init(&local_a0,(EVP_PKEY_CTX *)0x1);
  this_00 = local_a8;
  uVar13 = 0;
  if ((char)iVar4 != '\0') {
    uVar9 = 0x16;
    uVar5 = 0x14;
    do {
      if (uVar5 == 0xffffffffffffffff) {
        uVar9 = 0;
        break;
      }
      uVar6 = uVar5 & 0xffffffff;
      uVar9 = uVar9 - 1;
      uVar5 = uVar5 - 1;
    } while (local_a0.m_code_sizes.m_p[(byte)(&g_most_probable_codelength_codes)[uVar6]] == '\0');
    if ((char)local_d0 == '\0') {
      record_put_bits(local_a8,min_new_capacity,0xe);
      record_put_bits(this_00,uVar9,5);
      if (uVar9 != 0) {
        uVar5 = 0;
        do {
          record_put_bits(this_00,(uint)local_a0.m_code_sizes.m_p
                                        [(byte)(&g_most_probable_codelength_codes)[uVar5]],3);
          uVar5 = uVar5 + 1;
        } while (uVar9 != uVar5);
      }
    }
    uVar13 = uVar9 * 3 + 0x13;
    if (local_c8.m_size != 0) {
      uVar5 = 0;
      do {
        uVar2 = local_c8.m_p[uVar5];
        uVar6 = (ulong)uVar2 & 0xff;
        uVar12 = 0;
        switch((int)uVar6) {
        case 0x11:
          uVar12 = 3;
          break;
        case 0x12:
          uVar12 = 7;
          break;
        case 0x13:
          uVar12 = 2;
          break;
        case 0x14:
          uVar12 = 6;
          break;
        default:
          bVar3 = true;
          goto LAB_001a5852;
        }
        bVar3 = false;
LAB_001a5852:
        bVar1 = local_a0.m_code_sizes.m_p[uVar6];
        if ((char)local_d0 == '\0') {
          record_put_bits(local_a8,(uint)local_a0.m_codes.m_p[uVar6],(uint)bVar1);
        }
        uVar13 = uVar13 + bVar1;
        if (!bVar3) {
          if ((char)local_d0 == '\0') {
            encode_bits(local_a8,(uint)(uVar2 >> 8),uVar12);
          }
          uVar13 = uVar13 + uVar12;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (local_c8._8_8_ & 0xffffffff));
    }
  }
  static_huffman_data_model::~static_huffman_data_model(&local_a0);
LAB_001a58be:
  if ((byte *)local_b8.m_p != (byte *)0x0) {
    crnlib_free(local_b8.m_p);
  }
  if (local_c8.m_p != (unsigned_short *)0x0) {
    crnlib_free(local_c8.m_p);
  }
  return uVar13;
}

Assistant:

uint symbol_codec::encode_transmit_static_huffman_data_model(static_huffman_data_model& model, bool simulate = false, static_huffman_data_model* pDeltaModel) {
  CRNLIB_ASSERT(m_mode == cEncoding);

  uint total_used_syms = 0;
  for (uint i = model.m_total_syms; i > 0; i--) {
    if (model.m_code_sizes[i - 1]) {
      total_used_syms = i;
      break;
    }
  }

  if (!total_used_syms) {
    if (!simulate) {
      encode_bits(0, math::total_bits(prefix_coding::cMaxSupportedSyms));
    }

    return math::total_bits(prefix_coding::cMaxSupportedSyms);
  }

  crnlib::vector<uint16> codes;
  codes.reserve(model.m_total_syms);

  uint prev_len = UINT_MAX;
  uint cur_zero_run_size = 0;
  uint cur_nonzero_run_size = 0;

  const uint8* pCodesizes = &model.m_code_sizes[0];

  crnlib::vector<uint8> delta_code_sizes;
  if ((pDeltaModel) && (pDeltaModel->get_total_syms())) {
    if (pDeltaModel->m_code_sizes.size() < total_used_syms)
      return 0;

    delta_code_sizes.resize(total_used_syms);
    for (uint i = 0; i < total_used_syms; i++) {
      int delta = (int)model.m_code_sizes[i] - (int)pDeltaModel->m_code_sizes[i];
      if (delta < 0)
        delta += 17;
      delta_code_sizes[i] = static_cast<uint8>(delta);
    }

    pCodesizes = delta_code_sizes.get_ptr();
  }

  for (uint i = 0; i <= total_used_syms; i++) {
    const uint len = (i < total_used_syms) ? *pCodesizes++ : 0xFF;
    CRNLIB_ASSERT((len == 0xFF) || (len <= prefix_coding::cMaxExpectedCodeSize));

    if (!len) {
      end_nonzero_run(cur_nonzero_run_size, prev_len, codes);

      if (++cur_zero_run_size == cMaxLargeZeroRunSize)
        end_zero_run(cur_zero_run_size, codes);
    } else {
      end_zero_run(cur_zero_run_size, codes);

      if (len != prev_len) {
        end_nonzero_run(cur_nonzero_run_size, prev_len, codes);

        if (len != 0xFF)
          codes.push_back(static_cast<uint16>(len));
      } else if (++cur_nonzero_run_size == cLargeMaxNonZeroRunSize)
        end_nonzero_run(cur_nonzero_run_size, prev_len, codes);
    }

    prev_len = len;
  }

  uint16 hist[cMaxCodelengthCodes];
  utils::zero_object(hist);

  for (uint i = 0; i < codes.size(); i++) {
    uint code = codes[i] & 0xFF;
    CRNLIB_ASSERT(code < cMaxCodelengthCodes);
    hist[code] = static_cast<uint16>(hist[code] + 1);
  }

  static_huffman_data_model dm;
  if (!dm.init(true, cMaxCodelengthCodes, hist, 7))
    return 0;

  uint num_codelength_codes_to_send;
  for (num_codelength_codes_to_send = cNumMostProbableCodelengthCodes; num_codelength_codes_to_send > 0; num_codelength_codes_to_send--)
    if (dm.get_cost(g_most_probable_codelength_codes[num_codelength_codes_to_send - 1]))
      break;

  uint total_bits = math::total_bits(prefix_coding::cMaxSupportedSyms);
  total_bits += 5;
  total_bits += 3 * num_codelength_codes_to_send;

  if (!simulate) {
    encode_bits(total_used_syms, math::total_bits(prefix_coding::cMaxSupportedSyms));

    encode_bits(num_codelength_codes_to_send, 5);
    for (uint i = 0; i < num_codelength_codes_to_send; i++)
      encode_bits(dm.get_cost(g_most_probable_codelength_codes[i]), 3);
  }

  for (uint i = 0; i < codes.size(); i++) {
    uint code = codes[i];
    uint extra = code >> 8;
    code &= 0xFF;

    uint extra_bits = 0;
    if (code == cSmallZeroRunCode)
      extra_bits = cSmallZeroRunExtraBits;
    else if (code == cLargeZeroRunCode)
      extra_bits = cLargeZeroRunExtraBits;
    else if (code == cSmallRepeatCode)
      extra_bits = cSmallNonZeroRunExtraBits;
    else if (code == cLargeRepeatCode)
      extra_bits = cLargeNonZeroRunExtraBits;

    total_bits += dm.get_cost(code);

    if (!simulate)
      encode(code, dm);

    if (extra_bits) {
      if (!simulate)
        encode_bits(extra, extra_bits);

      total_bits += extra_bits;
    }
  }

  return total_bits;
}